

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,google::protobuf::internal::InternalMetadataWithArenaLite>
          (ExtensionSet *this,char *ptr,MessageLite *containing_type,
          InternalMetadataWithArenaLite *metadata,ParseContext *ctx)

{
  StringPiece val;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  Data *pDVar4;
  undefined4 extraout_var;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *in_RCX;
  ParseContext *pPVar5;
  ParseContext *in_RSI;
  ParseContext *in_R8;
  int32 size;
  ParseContext tmp_ctx;
  char *p;
  MessageLite *value;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  uint64 tmp;
  uint32 tag;
  uint32 type_id;
  string payload;
  ParseContext *in_stack_fffffffffffffdd8;
  ParseContext *in_stack_fffffffffffffde0;
  ParseContext *in_stack_fffffffffffffde8;
  ParseContext *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  uint32 in_stack_fffffffffffffdfc;
  ParseContext *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  *in_stack_fffffffffffffe10;
  MessageFactory *in_stack_fffffffffffffe18;
  ExtensionSet *in_stack_fffffffffffffe20;
  DescriptorPool *in_stack_fffffffffffffe30;
  ParseContext *local_1a8;
  ParseContext *in_stack_fffffffffffffe60;
  Container *in_stack_fffffffffffffe68;
  Container *in_stack_fffffffffffffe70;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  int in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined1 local_150 [48];
  FieldDescriptor *in_stack_fffffffffffffee0;
  MessageLite *in_stack_fffffffffffffee8;
  FieldType in_stack_fffffffffffffef3;
  int in_stack_fffffffffffffef4;
  ExtensionSet *in_stack_fffffffffffffef8;
  DescriptorPool *in_stack_ffffffffffffff10;
  MessageFactory *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  ParseContext *in_stack_ffffffffffffff28;
  undefined1 local_b9 [2];
  byte local_b7;
  undefined4 local_94;
  undefined8 local_90;
  uint local_88;
  int local_74;
  string local_70 [32];
  ParseContext *local_50;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *local_48;
  ParseContext *local_38;
  ParseContext *local_28;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *local_20;
  Container *local_18;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *local_10;
  InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
  *local_8;
  
  local_50 = in_R8;
  local_48 = in_RCX;
  local_38 = in_RSI;
  std::__cxx11::string::string(local_70);
  local_74 = 0;
  local_1a8 = in_stack_ffffffffffffff28;
  do {
    while( true ) {
      while( true ) {
        bVar1 = ParseContext::Done(in_stack_fffffffffffffde0,(char **)in_stack_fffffffffffffdd8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_28 = local_38;
          goto LAB_0075acb4;
        }
        pPVar5 = (ParseContext *)((long)&(local_38->super_EpsCopyInputStream).limit_end_ + 1);
        local_88 = (uint)*(byte *)&(local_38->super_EpsCopyInputStream).limit_end_;
        local_38 = pPVar5;
        if (local_88 != 0x10) break;
        local_38 = (ParseContext *)
                   ParseBigVarint((char *)CONCAT44(in_stack_fffffffffffffdfc,
                                                   in_stack_fffffffffffffdf8),
                                  (uint64 *)in_stack_fffffffffffffdf0);
        if (local_38 == (ParseContext *)0x0) {
          local_28 = (ParseContext *)0x0;
          goto LAB_0075acb4;
        }
        local_74 = (int)local_90;
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          ExtensionInfo::ExtensionInfo((ExtensionInfo *)(local_b9 + 1));
          in_stack_fffffffffffffdd8 = (ParseContext *)local_b9;
          bVar1 = FindExtension(in_stack_fffffffffffffe20,
                                (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                                (uint32)in_stack_fffffffffffffe18,
                                (MessageLite *)in_stack_fffffffffffffe10,
                                (ParseContext *)
                                CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                                (ExtensionInfo *)in_stack_fffffffffffffe00,
                                (bool *)in_stack_fffffffffffffe30);
          in_stack_fffffffffffffe8c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
          if (bVar1) {
            if ((local_b7 & 1) == 0) {
              local_1a8 = (ParseContext *)
                          MutableMessage(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                                         in_stack_fffffffffffffef3,in_stack_fffffffffffffee8,
                                         in_stack_fffffffffffffee0);
            }
            else {
              local_1a8 = (ParseContext *)
                          AddMessage((ExtensionSet *)local_1a8,in_stack_ffffffffffffff24,
                                     (FieldType)((uint)in_stack_ffffffffffffff20 >> 0x18),
                                     (MessageLite *)in_stack_ffffffffffffff18,
                                     (FieldDescriptor *)in_stack_ffffffffffffff10);
              in_stack_fffffffffffffe60 = local_1a8;
            }
            ParseContext::depth(local_50);
            ParseContext::ParseContext<std::__cxx11::string&>
                      (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                       SUB41((uint)in_stack_fffffffffffffdf8 >> 0x18,0),
                       (char **)in_stack_fffffffffffffdf0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffde8);
            pDVar4 = ParseContext::data(local_50);
            in_stack_fffffffffffffe30 = pDVar4->pool;
            pDVar4 = ParseContext::data((ParseContext *)local_150);
            pDVar4->pool = in_stack_fffffffffffffe30;
            pDVar4 = ParseContext::data(local_50);
            in_stack_fffffffffffffe18 = pDVar4->factory;
            in_stack_fffffffffffffe20 =
                 (ExtensionSet *)ParseContext::data((ParseContext *)local_150);
            *(MessageFactory **)&in_stack_fffffffffffffe20->flat_capacity_ =
                 in_stack_fffffffffffffe18;
            iVar2 = (**(_func_int **)((long)(local_1a8->super_EpsCopyInputStream).limit_end_ + 0x68)
                    )(local_1a8,CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      local_150);
            in_stack_fffffffffffffe10 =
                 (InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                  *)CONCAT44(extraout_var,iVar2);
            if ((in_stack_fffffffffffffe10 ==
                 (InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                  *)0x0) ||
               (in_stack_fffffffffffffe0f =
                     EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)local_150),
               !(bool)in_stack_fffffffffffffe0f)) {
              local_28 = (ParseContext *)0x0;
              goto LAB_0075acb4;
            }
          }
          else {
            in_stack_fffffffffffffe88 = local_74;
            StringPiece::StringPiece<std::allocator<char>>
                      ((StringPiece *)in_stack_fffffffffffffde0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdd8);
            local_20 = local_48;
            local_10 = local_48;
            local_8 = local_48;
            in_stack_fffffffffffffe87 = ((uint)*(undefined8 *)local_48 & 1) == 1;
            in_stack_fffffffffffffe78 = local_48;
            if ((bool)in_stack_fffffffffffffe87) {
              local_18 = InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                         ::
                         PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                                   (local_48);
            }
            else {
              in_stack_fffffffffffffe70 =
                   (Container *)
                   InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                   ::mutable_unknown_fields_slow(in_stack_fffffffffffffe10);
              local_18 = in_stack_fffffffffffffe70;
            }
            val.ptr_._4_4_ = in_stack_fffffffffffffdfc;
            val.ptr_._0_4_ = in_stack_fffffffffffffdf8;
            val.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe00;
            in_stack_fffffffffffffe68 = local_18;
            WriteLengthDelimited
                      ((uint32)((ulong)in_stack_fffffffffffffdf0 >> 0x20),val,
                       (string *)in_stack_fffffffffffffde8);
          }
          local_74 = 0;
        }
      }
      if (local_88 != 0x1a) break;
      if (local_74 == 0) {
        in_stack_fffffffffffffdfc =
             ReadSize((char **)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
        if (local_38 == (ParseContext *)0x0) {
          local_28 = (ParseContext *)0x0;
          goto LAB_0075acb4;
        }
        in_stack_fffffffffffffdf0 =
             (ParseContext *)
             EpsCopyInputStream::ReadString
                       ((EpsCopyInputStream *)
                        CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                        (char *)in_stack_fffffffffffffdf0,
                        (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                        (string *)in_stack_fffffffffffffde0);
        local_38 = in_stack_fffffffffffffdf0;
        if (in_stack_fffffffffffffdf0 == (ParseContext *)0x0) {
          local_28 = (ParseContext *)0x0;
          goto LAB_0075acb4;
        }
      }
      else {
        in_stack_fffffffffffffe00 =
             (ParseContext *)
             ParseFieldMaybeLazily
                       ((ExtensionSet *)in_stack_fffffffffffffe00,
                        CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                        (char *)in_stack_fffffffffffffdf0,(MessageLite *)in_stack_fffffffffffffde8,
                        (InternalMetadataWithArenaLite *)in_stack_fffffffffffffde0,
                        in_stack_fffffffffffffdd8);
        local_38 = in_stack_fffffffffffffe00;
        if (in_stack_fffffffffffffe00 == (ParseContext *)0x0) {
          local_28 = (ParseContext *)0x0;
          goto LAB_0075acb4;
        }
        local_74 = 0;
      }
    }
    in_stack_fffffffffffffde8 =
         (ParseContext *)
         ReadTag((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                 (uint32 *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    local_38 = in_stack_fffffffffffffde8;
    if ((local_88 == 0) || ((local_88 & 7) == 4)) {
      EpsCopyInputStream::SetLastTag(&local_50->super_EpsCopyInputStream,local_88);
      local_28 = local_38;
      goto LAB_0075acb4;
    }
    in_stack_fffffffffffffde0 =
         (ParseContext *)
         ParseField((ExtensionSet *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                    CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                    (char *)in_stack_fffffffffffffe78,(MessageLite *)in_stack_fffffffffffffe70,
                    (InternalMetadataWithArenaLite *)in_stack_fffffffffffffe68,
                    in_stack_fffffffffffffe60);
    local_38 = in_stack_fffffffffffffde0;
  } while (in_stack_fffffffffffffde0 != (ParseContext *)0x0);
  local_28 = (ParseContext *)0x0;
LAB_0075acb4:
  local_94 = 1;
  std::__cxx11::string::~string(local_70);
  return (char *)local_28;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(const char* ptr,
                                                  const Msg* containing_type,
                                                  Metadata* metadata,
                                                  internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}